

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackPropertiesGenerator.cxx
# Opt level: O0

void __thiscall
cmCPackPropertiesGenerator::GenerateScriptForConfig
          (cmCPackPropertiesGenerator *this,ostream *os,string *config,Indent indent)

{
  cmLocalGenerator *pcVar1;
  Property *this_00;
  bool bVar2;
  cmCompiledGeneratorExpression *this_01;
  string *psVar3;
  PropertyMapType *this_02;
  ostream *poVar4;
  pointer this_03;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  string_view str;
  string_view str_00;
  string_view str_01;
  string local_180;
  string local_160;
  string local_140 [8];
  string value;
  value_type *j;
  const_iterator __end2;
  const_iterator __begin2;
  ExpressionVectorType *__range2;
  string local_f0;
  undefined1 local_d0 [16];
  string local_c0;
  int local_9c;
  Property *local_98;
  Property *property;
  string *name;
  value_type *i;
  const_iterator __end1;
  const_iterator __begin1;
  PropertyMapType *__range1;
  PropertyMapType *properties;
  string local_50;
  string *local_30;
  string *expandedFileName;
  string *config_local;
  ostream *os_local;
  cmCPackPropertiesGenerator *this_local;
  Indent indent_local;
  
  expandedFileName = config;
  config_local = (string *)os;
  os_local = (ostream *)this;
  this_local._4_4_ = indent.Level;
  this_01 = cmInstalledFile::GetNameExpression(this->InstalledFile);
  psVar3 = expandedFileName;
  pcVar1 = this->LG;
  std::__cxx11::string::string((string *)&local_50);
  uVar5 = 0;
  psVar3 = cmCompiledGeneratorExpression::Evaluate
                     (this_01,pcVar1,psVar3,(cmGeneratorTarget *)0x0,
                      (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  local_30 = psVar3;
  this_02 = cmInstalledFile::GetProperties_abi_cxx11_(this->InstalledFile);
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property>_>_>
           ::begin(this_02);
  i = (value_type *)
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property>_>_>
      ::end(this_02);
  while( true ) {
    bVar2 = std::operator!=(&__end1,(_Self *)&i);
    if (!bVar2) break;
    property = (Property *)
               std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property>_>
               ::operator*(&__end1);
    local_98 = &((reference)property)->second;
    local_9c = this_local._4_4_;
    name = (string *)property;
    poVar4 = ::operator<<((ostream *)config_local,(cmScriptGeneratorIndent)this_local._4_4_);
    poVar4 = std::operator<<(poVar4,"set_property(INSTALL ");
    auVar6 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_30);
    str._M_len = auVar6._8_8_;
    str._M_str = (char *)0x0;
    local_d0 = auVar6;
    cmOutputConverter::EscapeForCMake_abi_cxx11_(&local_c0,auVar6._0_8_,str,(WrapQuotes)uVar5);
    poVar4 = std::operator<<(poVar4,(string *)&local_c0);
    poVar4 = std::operator<<(poVar4," PROPERTY ");
    auVar6 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)property);
    str_00._M_len = auVar6._8_8_;
    str_00._M_str = (char *)0x0;
    cmOutputConverter::EscapeForCMake_abi_cxx11_(&local_f0,auVar6._0_8_,str_00,(WrapQuotes)uVar5);
    std::operator<<(poVar4,(string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_c0);
    this_00 = local_98;
    __end2 = std::
             vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
             ::begin(&local_98->ValueExpressions);
    j = (value_type *)
        std::
        vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
        ::end(&this_00->ValueExpressions);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_*,_std::vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>_>
                                  *)&j);
      if (!bVar2) break;
      value.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<const_std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_*,_std::vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>_>
           ::operator*(&__end2);
      this_03 = std::
                unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                              *)value.field_2._8_8_);
      psVar3 = expandedFileName;
      pcVar1 = this->LG;
      std::__cxx11::string::string((string *)&local_160);
      uVar5 = 0;
      psVar3 = cmCompiledGeneratorExpression::Evaluate
                         (this_03,pcVar1,psVar3,(cmGeneratorTarget *)0x0,
                          (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&local_160
                         );
      std::__cxx11::string::string(local_140,(string *)psVar3);
      std::__cxx11::string::~string((string *)&local_160);
      poVar4 = std::operator<<((ostream *)config_local," ");
      auVar6 = std::__cxx11::string::operator_cast_to_basic_string_view(local_140);
      str_01._M_len = auVar6._8_8_;
      str_01._M_str = (char *)0x0;
      cmOutputConverter::EscapeForCMake_abi_cxx11_(&local_180,auVar6._0_8_,str_01,(WrapQuotes)uVar5)
      ;
      std::operator<<(poVar4,(string *)&local_180);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string(local_140);
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_*,_std::vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>_>
      ::operator++(&__end2);
    }
    std::operator<<((ostream *)config_local,")\n");
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void cmCPackPropertiesGenerator::GenerateScriptForConfig(
  std::ostream& os, const std::string& config, Indent indent)
{
  std::string const& expandedFileName =
    this->InstalledFile.GetNameExpression().Evaluate(this->LG, config);

  cmInstalledFile::PropertyMapType const& properties =
    this->InstalledFile.GetProperties();

  for (cmInstalledFile::PropertyMapType::value_type const& i : properties) {
    std::string const& name = i.first;
    cmInstalledFile::Property const& property = i.second;

    os << indent << "set_property(INSTALL "
       << cmOutputConverter::EscapeForCMake(expandedFileName) << " PROPERTY "
       << cmOutputConverter::EscapeForCMake(name);

    for (cmInstalledFile::ExpressionVectorType::value_type const& j :
         property.ValueExpressions) {
      std::string value = j->Evaluate(this->LG, config);
      os << " " << cmOutputConverter::EscapeForCMake(value);
    }

    os << ")\n";
  }
}